

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal.cc
# Opt level: O2

fdb_status wal_itr_init(filemgr *file,snap_handle *shandle,bool by_key,wal_iterator **wal_iterator)

{
  wal *pwVar1;
  size_t __nmemb;
  wal_iterator *pwVar2;
  wal_cursor *pwVar3;
  fdb_status fVar4;
  bool bVar5;
  
  pwVar2 = (wal_iterator *)malloc(0x50);
  if (pwVar2 == (wal_iterator *)0x0) {
    fVar4 = FDB_RESULT_ALLOC_FAIL;
  }
  else {
    if (by_key) {
      pwVar2->map_shards = file->wal->key_shards;
      avl_init(&pwVar2->merge_tree,&shandle->cmp_info);
      bVar5 = true;
    }
    else {
      if (file->config->seqtree_opt != '\x01') {
        return FDB_RESULT_INVALID_CONFIG;
      }
      pwVar2->map_shards = file->wal->seq_shards;
      bVar5 = false;
      avl_init(&pwVar2->merge_tree,(void *)0x0);
    }
    pwVar2->by_key = bVar5;
    pwVar2->multi_kvs = (shandle->cmp_info).kvs != (kvs_info *)0x0;
    pwVar2->cursor_pos = (avl_node *)0x0;
    pwVar2->item_prev = (wal_item *)0x0;
    pwVar1 = file->wal;
    __nmemb = pwVar1->num_shards;
    pwVar2->num_shards = __nmemb;
    fVar4 = FDB_RESULT_SUCCESS;
    if (shandle->is_persisted_snapshot == false) {
      pwVar3 = (wal_cursor *)calloc(__nmemb,0x30);
    }
    else {
      pwVar3 = (wal_cursor *)0x0;
    }
    pwVar2->cursors = pwVar3;
    pwVar2->shandle = shandle;
    pwVar2->_wal = pwVar1;
    pwVar2->direction = '\0';
    *wal_iterator = pwVar2;
  }
  return fVar4;
}

Assistant:

fdb_status wal_itr_init(struct filemgr *file,
                        struct snap_handle *shandle,
                        bool by_key,
                        struct wal_iterator **wal_iterator)
{
    struct wal_iterator *wal_itr = (struct wal_iterator *)
                      malloc(sizeof(struct wal_iterator));
    if (!wal_itr) { // LCOV_EXCL_START
        return FDB_RESULT_ALLOC_FAIL;
    } // LCOV_EXCL_STOP

    // If key_cmp_info is non-null it implies key-range iteration
    if (by_key) {
        wal_itr->map_shards = file->wal->key_shards;
        avl_init(&wal_itr->merge_tree, &shandle->cmp_info);
        wal_itr->by_key = true;
    } else {
        // Otherwise wal iteration is requested over sequence range
        if (file->config->seqtree_opt != FDB_SEQTREE_USE) {
            return FDB_RESULT_INVALID_CONFIG;
        }
        wal_itr->map_shards = file->wal->seq_shards;
        avl_init(&wal_itr->merge_tree, NULL);
        wal_itr->by_key = false;
    }

    if (shandle->cmp_info.kvs) {
        wal_itr->multi_kvs = true;
    } else {
        wal_itr->multi_kvs = false;
    }
    wal_itr->cursor_pos = NULL;
    wal_itr->item_prev = NULL;

    wal_itr->num_shards = file->wal->num_shards;
    if (!shandle->is_persisted_snapshot) {
        wal_itr->cursors = (struct wal_cursor *)calloc(wal_itr->num_shards,
                           sizeof(struct wal_cursor));
    } else {
        wal_itr->cursors = NULL;
    }
    wal_itr->shandle = shandle;
    wal_itr->_wal = file->wal;
    wal_itr->direction = FDB_ITR_DIR_NONE;
    *wal_iterator = wal_itr;
    return FDB_RESULT_SUCCESS;
}